

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void __thiscall
cfd::core::JsonObjectVector<cfd::js::api::json::PsbtGlobalXpub,_cfd::js::api::PsbtGlobalXpubStruct>
::ConvertFromStruct(JsonObjectVector<cfd::js::api::json::PsbtGlobalXpub,_cfd::js::api::PsbtGlobalXpubStruct>
                    *this,vector<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
                          *list)

{
  pointer pPVar1;
  pointer data;
  PsbtGlobalXpub object;
  PsbtGlobalXpub local_130;
  
  pPVar1 = (list->
           super__Vector_base<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (data = (list->
              super__Vector_base<cfd::js::api::PsbtGlobalXpubStruct,_std::allocator<cfd::js::api::PsbtGlobalXpubStruct>_>
              )._M_impl.super__Vector_impl_data._M_start; data != pPVar1; data = data + 1) {
    js::api::json::PsbtGlobalXpub::PsbtGlobalXpub(&local_130);
    js::api::json::PsbtGlobalXpub::ConvertFromStruct(&local_130,data);
    std::
    vector<cfd::js::api::json::PsbtGlobalXpub,_std::allocator<cfd::js::api::json::PsbtGlobalXpub>_>
    ::push_back(&(this->super_JsonVector<cfd::js::api::json::PsbtGlobalXpub>).
                 super_vector<cfd::js::api::json::PsbtGlobalXpub,_std::allocator<cfd::js::api::json::PsbtGlobalXpub>_>
                ,&local_130);
    js::api::json::PsbtGlobalXpub::~PsbtGlobalXpub(&local_130);
  }
  return;
}

Assistant:

void ConvertFromStruct(const std::vector<STRUCT_TYPE>& list) {
    for (const auto& element : list) {
      TYPE object;
      object.ConvertFromStruct(element);
      std::vector<TYPE>::push_back(object);
    }
  }